

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count_Heap.h
# Opt level: O2

void __thiscall Count_Heap<4U>::Init(Count_Heap<4U> *this,Data<4U> *item)

{
  Heap<4U> *this_00;
  uint uVar1;
  int iVar2;
  int *result;
  int iVar3;
  uint32_t i;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)this->hash_num;
  result = (int *)operator_new__(uVar5 << 2);
  for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    uVar1 = Data<4U>::Hash(item,(uint)uVar4);
    uVar5 = (ulong)uVar1 % (ulong)this->length;
    uVar1 = Data<4U>::Hash(item,(uint)uVar4 + 0x65);
    iVar2 = COUNT[uVar1 & 1];
    iVar3 = this->counter[uVar4][uVar5] + iVar2;
    this->counter[uVar4][uVar5] = iVar3;
    result[uVar4] = iVar3 * iVar2;
    uVar5 = (ulong)this->hash_num;
  }
  this_00 = this->heap;
  iVar2 = Get_Median(result,(uint32_t)uVar5);
  Heap<4U>::Insert(this_00,item,iVar2);
  operator_delete__(result);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		int* result = new int[hash_num];

		for (uint32_t i = 0; i < hash_num; ++i) {
			uint32_t position = item.Hash(i) % length;
			uint32_t choice = item.Hash(i + 101) & 1;
			counter[i][position] += COUNT[choice];
			result[i] = counter[i][position] * COUNT[choice];
		}

		heap->Insert(item, Get_Median(result, hash_num));
		delete[] result;
	}